

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::IsConcreteType
          (ReplaceDescArrayAccessUsingVarIndex *this,uint32_t type_id)

{
  Op OVar1;
  bool bVar2;
  uint32_t uVar3;
  DefUseManager *this_00;
  Instruction *this_01;
  uint32_t i;
  uint32_t index;
  bool bVar4;
  
  while( true ) {
    this_00 = Pass::get_def_use_mgr(&this->super_Pass);
    this_01 = analysis::DefUseManager::GetDef(this_00,type_id);
    OVar1 = this_01->opcode_;
    if (OpTypeStruct < OVar1) {
      return false;
    }
    if ((0x11800000U >> (OVar1 & OpTypeOpaque) & 1) == 0) break;
    type_id = Instruction::GetSingleWordInOperand(this_01,0);
  }
  if ((0x600000U >> (OVar1 & OpTypeOpaque) & 1) == 0) {
    if (OVar1 != OpTypeStruct) {
      return false;
    }
    index = 0;
    do {
      uVar3 = Instruction::NumInOperands(this_01);
      bVar4 = uVar3 <= index;
      if (bVar4) {
        return bVar4;
      }
      uVar3 = Instruction::GetSingleWordInOperand(this_01,index);
      bVar2 = IsConcreteType(this,uVar3);
      index = index + 1;
    } while (bVar2);
    return bVar4;
  }
  return true;
}

Assistant:

bool ReplaceDescArrayAccessUsingVarIndex::IsConcreteType(
    uint32_t type_id) const {
  Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);
  if (type_inst->opcode() == spv::Op::OpTypeInt ||
      type_inst->opcode() == spv::Op::OpTypeFloat) {
    return true;
  }
  if (type_inst->opcode() == spv::Op::OpTypeVector ||
      type_inst->opcode() == spv::Op::OpTypeMatrix ||
      type_inst->opcode() == spv::Op::OpTypeArray) {
    return IsConcreteType(type_inst->GetSingleWordInOperand(0));
  }
  if (type_inst->opcode() == spv::Op::OpTypeStruct) {
    for (uint32_t i = 0; i < type_inst->NumInOperands(); ++i) {
      if (!IsConcreteType(type_inst->GetSingleWordInOperand(i))) return false;
    }
    return true;
  }
  return false;
}